

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O1

double wabt::interp::FloatDiv<double>(double lhs,double rhs)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  uint uVar2;
  ulong in_XMM0_Qb;
  ulong in_XMM1_Qb;
  
  if ((rhs != 0.0) || (NAN(rhs))) {
    if (!NAN(lhs / rhs)) {
      return lhs / rhs;
    }
  }
  else if (lhs != 0.0) {
    auVar1._8_8_ = in_XMM1_Qb ^ in_XMM0_Qb;
    auVar1._0_8_ = (ulong)rhs ^ (ulong)lhs;
    uVar2 = movmskpd(in_EAX,auVar1);
    return *(double *)(&DAT_00202390 + (ulong)(uVar2 & 1) * 8);
  }
  return NAN;
}

Assistant:

T WABT_VECTORCALL FloatDiv(T lhs, T rhs) {
  // IEE754 specifies what should happen when dividing a float by zero, but
  // C/C++ says it is undefined behavior.
  if (WABT_UNLIKELY(rhs == 0)) {
    return std::isnan(lhs) || lhs == 0
               ? std::numeric_limits<T>::quiet_NaN()
               : ((std::signbit(lhs) ^ std::signbit(rhs))
                      ? -std::numeric_limits<T>::infinity()
                      : std::numeric_limits<T>::infinity());
  }
  return CanonNaN(lhs / rhs);
}